

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

TPZManVector<float,_10> * __thiscall
TPZManVector<float,_10>::operator=(TPZManVector<float,_10> *this,TPZManVector<float,_10> *rval)

{
  ulong uVar1;
  float *pfVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  
  if (this == rval) goto LAB_00b2df98;
  uVar1 = (rval->super_TPZVec<float>).fNElements;
  pfVar2 = (this->super_TPZVec<float>).fStore;
  pfVar5 = this->fExtAlloc;
  if (pfVar2 != pfVar5 && pfVar2 != (float *)0x0) {
    operator_delete__(pfVar2);
    (this->super_TPZVec<float>).fStore = (float *)0x0;
  }
  if ((long)uVar1 < 0xb) {
    uVar4 = 0;
    iVar3 = 0;
    if (0 < (long)uVar1) {
      do {
        pfVar5[uVar4] = rval->fExtAlloc[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      iVar3 = (int)uVar1;
      if (9 < uVar1) {
        uVar4 = 0;
        goto LAB_00b2df8c;
      }
    }
    memset((void *)((long)this->fExtAlloc + (ulong)(uint)(iVar3 * 4)),0,
           (ulong)(iVar3 * -4 + 0x24) + 4);
    uVar4 = 0;
  }
  else {
    pfVar5 = (rval->super_TPZVec<float>).fStore;
    uVar4 = uVar1;
  }
LAB_00b2df8c:
  (this->super_TPZVec<float>).fStore = pfVar5;
  (this->super_TPZVec<float>).fNAlloc = uVar4;
  (this->super_TPZVec<float>).fNElements = uVar1;
LAB_00b2df98:
  (rval->super_TPZVec<float>).fStore = (float *)0x0;
  (rval->super_TPZVec<float>).fNElements = 0;
  (rval->super_TPZVec<float>).fNAlloc = 0;
  return this;
}

Assistant:

TPZManVector< T, NumExtAlloc >& TPZManVector< T, NumExtAlloc >::operator=(TPZManVector< T, NumExtAlloc >&& rval) {
    // Checking auto assignment.
    if (this != &rval) {
      const int64_t nel = rval.NElements();
      //let us dispose of previously allocated memory
      if (this->fStore && this->fStore != fExtAlloc) {
        delete[] this->fStore;
        this->fStore = nullptr;
        this->fNAlloc = 0;
      }
      if (nel <= NumExtAlloc) {
        //we need to copy, unfortunately
        int i = 0;
        for(; i < nel; i++) {fExtAlloc[i] = rval.fExtAlloc[i];}
        for(; i < NumExtAlloc; i++){fExtAlloc[i] = T();}
        this->fStore = fExtAlloc;
        this->fNAlloc = 0;
        this->fNElements = nel;
      } else {
        this->fStore = rval.fStore;
        this->fNAlloc = nel;
        this->fNElements = nel;
      }
    }
    rval.fStore = nullptr;
    rval.fNAlloc = 0;
    rval.fNElements = 0;
    return *this;
}